

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeChangeP4(Vdbe *p,int addr,char *zP4,int n)

{
  char *zP4_00;
  Op *pOp_00;
  int in_ECX;
  VTable *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  sqlite3 *db;
  Op *pOp;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_c;
  
  zP4_00 = (char *)*in_RDI;
  if (zP4_00[0x67] == '\0') {
    local_c = in_ESI;
    if (in_ESI < 0) {
      local_c = *(int *)(in_RDI + 0x12) + -1;
    }
    pOp_00 = (Op *)(in_RDI[0x11] + (long)local_c * 0x18);
    if ((in_ECX < 0) && (pOp_00->p4type == '\0')) {
      if (in_ECX == -3) {
        (pOp_00->p4).i = (int)in_RDX;
        pOp_00->p4type = -3;
      }
      else if (in_RDX != (VTable *)0x0) {
        (pOp_00->p4).pVtab = in_RDX;
        pOp_00->p4type = (char)in_ECX;
        if (in_ECX == -0xb) {
          sqlite3VtabLock(in_RDX);
        }
      }
    }
    else {
      vdbeChangeP4Full((Vdbe *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),pOp_00,zP4_00,
                       in_stack_ffffffffffffffcc);
    }
  }
  else if (in_ECX != -0xb) {
    freeP4((sqlite3 *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),-0x55555556,zP4_00);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeP4(Vdbe *p, int addr, const char *zP4, int n){
  Op *pOp;
  sqlite3 *db;
  assert( p!=0 );
  db = p->db;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( p->aOp!=0 || db->mallocFailed );
  if( db->mallocFailed ){
    if( n!=P4_VTAB ) freeP4(db, n, (void*)*(char**)&zP4);
    return;
  }
  assert( p->nOp>0 );
  assert( addr<p->nOp );
  if( addr<0 ){
    addr = p->nOp - 1;
  }
  pOp = &p->aOp[addr];
  if( n>=0 || pOp->p4type ){
    vdbeChangeP4Full(p, pOp, zP4, n);
    return;
  }
  if( n==P4_INT32 ){
    /* Note: this cast is safe, because the origin data point was an int
    ** that was cast to a (const char *). */
    pOp->p4.i = SQLITE_PTR_TO_INT(zP4);
    pOp->p4type = P4_INT32;
  }else if( zP4!=0 ){
    assert( n<0 );
    pOp->p4.p = (void*)zP4;
    pOp->p4type = (signed char)n;
    if( n==P4_VTAB ) sqlite3VtabLock((VTable*)zP4);
  }
}